

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_gainer_config ma_gainer_config_init(ma_uint32 channels,ma_uint32 smoothTimeInFrames)

{
  ma_gainer_config mVar1;
  
  mVar1.smoothTimeInFrames = smoothTimeInFrames;
  mVar1.channels = channels;
  return mVar1;
}

Assistant:

MA_API ma_gainer_config ma_gainer_config_init(ma_uint32 channels, ma_uint32 smoothTimeInFrames)
{
    ma_gainer_config config;

    MA_ZERO_OBJECT(&config);
    config.channels           = channels;
    config.smoothTimeInFrames = smoothTimeInFrames;

    return config;
}